

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavesplit.cpp
# Opt level: O0

void split_buffer(ui32_t sample_size,FrameBuffer *FrameBuffer,FrameBuffer *L_FrameBuffer,
                 FrameBuffer *R_FrameBuffer)

{
  ui32_t uVar1;
  byte_t *pbVar2;
  byte_t *local_48;
  byte_t *rp;
  byte_t *lp;
  byte_t *end_p;
  byte_t *p;
  FrameBuffer *R_FrameBuffer_local;
  FrameBuffer *L_FrameBuffer_local;
  FrameBuffer *FrameBuffer_local;
  ui32_t sample_size_local;
  
  uVar1 = ASDCP::FrameBuffer::Size(&FrameBuffer->super_FrameBuffer);
  if ((uVar1 & 1) == 0) {
    end_p = ASDCP::FrameBuffer::Data(&FrameBuffer->super_FrameBuffer);
    uVar1 = ASDCP::FrameBuffer::Size(&FrameBuffer->super_FrameBuffer);
    pbVar2 = end_p + uVar1;
    rp = ASDCP::FrameBuffer::Data(&L_FrameBuffer->super_FrameBuffer);
    local_48 = ASDCP::FrameBuffer::Data(&R_FrameBuffer->super_FrameBuffer);
    for (; end_p < pbVar2; end_p = end_p + sample_size + sample_size) {
      memcpy(rp,end_p,(ulong)sample_size);
      rp = rp + sample_size;
      memcpy(local_48,end_p + sample_size,(ulong)sample_size);
      local_48 = local_48 + sample_size;
    }
    uVar1 = ASDCP::FrameBuffer::Capacity(&L_FrameBuffer->super_FrameBuffer);
    ASDCP::FrameBuffer::Size(&L_FrameBuffer->super_FrameBuffer,uVar1);
    uVar1 = ASDCP::FrameBuffer::Capacity(&R_FrameBuffer->super_FrameBuffer);
    ASDCP::FrameBuffer::Size(&R_FrameBuffer->super_FrameBuffer,uVar1);
    return;
  }
  __assert_fail("(FrameBuffer.Size() % 2) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/wavesplit.cpp"
                ,0xda,
                "void split_buffer(ui32_t, PCM::FrameBuffer &, PCM::FrameBuffer &, PCM::FrameBuffer &)"
               );
}

Assistant:

void
split_buffer(ui32_t sample_size, PCM::FrameBuffer& FrameBuffer,
	     PCM::FrameBuffer& L_FrameBuffer, PCM::FrameBuffer& R_FrameBuffer)
{
  assert((FrameBuffer.Size() % 2) == 0);
  byte_t* p = FrameBuffer.Data();
  byte_t* end_p = p + FrameBuffer.Size();
  byte_t* lp = L_FrameBuffer.Data();
  byte_t* rp = R_FrameBuffer.Data();

  for ( ; p < end_p; )
    {
      memcpy(lp, p, sample_size);
      lp += sample_size;
      p += sample_size;
      memcpy(rp, p, sample_size);
      rp += sample_size;
      p += sample_size;
    }

  L_FrameBuffer.Size(L_FrameBuffer.Capacity());
  R_FrameBuffer.Size(R_FrameBuffer.Capacity());
}